

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

FTextureID __thiscall
DBaseDecal::StickToWall(DBaseDecal *this,side_t *wall,double x,double y,F3DFloor *ffloor)

{
  byte *pbVar1;
  double dVar2;
  uint uVar3;
  line_t_conflict *plVar4;
  double dVar5;
  sector_t_conflict *psVar6;
  splane *psVar7;
  DBaseDecal *pDVar8;
  uint uVar9;
  DBaseDecal **ppDVar10;
  FTextureID *pFVar11;
  DBaseDecal *pDVar12;
  double *pdVar13;
  double dVar14;
  bool bVar15;
  
  this->Side = wall;
  ppDVar10 = &wall->AttachedDecals;
  pDVar8 = wall->AttachedDecals;
  do {
    pDVar12 = pDVar8;
    if (pDVar12 == (DBaseDecal *)0x0) {
      pDVar12 = (DBaseDecal *)0x0;
      goto LAB_004b308f;
    }
    pDVar8 = pDVar12->WallNext;
  } while (pDVar12->WallNext != (DBaseDecal *)0x0);
  ppDVar10 = &pDVar12->WallNext;
LAB_004b308f:
  this->WallPrev = pDVar12;
  *ppDVar10 = this;
  this->WallNext = (DBaseDecal *)0x0;
  plVar4 = wall->linedef;
  bVar15 = plVar4->sidedef[0] == wall;
  dVar14 = plVar4->bbox[(ulong)!bVar15 + 4];
  dVar5 = plVar4->bbox[(ulong)bVar15 + 4];
  if (dVar5 == 0.0) {
    pbVar1 = (byte *)((long)&this->RenderFlags + 1);
    *pbVar1 = *pbVar1 | 3;
    pdVar13 = (double *)((long)dVar14 + 0xa8);
    if ((plVar4->flags & 0x10) != 0) {
      pdVar13 = (double *)((long)dVar14 + 0x50);
    }
    this->Z = this->Z - *pdVar13;
    pFVar11 = &wall->textures[1].texture;
    goto LAB_004b3205;
  }
  dVar2 = this->Z;
  if (dVar2 <= (*(double *)((long)dVar5 + 0xb8) * y +
               *(double *)((long)dVar5 + 200) + *(double *)((long)dVar5 + 0xb0) * x) *
               *(double *)((long)dVar5 + 0xd0)) {
    pbVar1 = (byte *)((long)&this->RenderFlags + 1);
    *pbVar1 = *pbVar1 | 0xe;
    pdVar13 = (double *)((long)dVar14 + 0xa8);
    if ((plVar4->flags & 0x10) == 0) {
      pdVar13 = (double *)((long)dVar5 + 0x50);
    }
    this->Z = dVar2 - *pdVar13;
LAB_004b31df:
    pFVar11 = &wall->textures[2].texture;
  }
  else {
    if ((*(double *)((long)dVar5 + 0xe0) * y +
        *(double *)((long)dVar5 + 0xf0) + *(double *)((long)dVar5 + 0xd8) * x) *
        *(double *)((long)dVar5 + 0xf8) <= dVar2) {
      pbVar1 = (byte *)((long)&this->RenderFlags + 1);
      *pbVar1 = *pbVar1 | 5;
      if ((plVar4->flags & 8) == 0) {
        dVar14 = dVar5;
      }
      this->Z = dVar2 - *(double *)((long)dVar14 + 0xa8);
    }
    else {
      if (ffloor == (F3DFloor *)0x0) {
        return (FTextureID)0;
      }
      psVar6 = (sector_t_conflict *)ffloor->model;
      this->Sector = psVar6;
      pbVar1 = (byte *)((long)&this->RenderFlags + 1);
      *pbVar1 = *pbVar1 | 0xb;
      psVar7 = psVar6->planes + 1;
      if ((plVar4->flags & 0x10) != 0) {
        psVar7 = psVar6->planes;
      }
      this->Z = dVar2 - psVar7->TexZ;
      if ((ffloor->flags >> 0x11 & 1) == 0) {
        if ((ffloor->flags >> 0x12 & 1) == 0) {
          pFVar11 = &ffloor->master->sidedef[0]->textures[1].texture;
          goto LAB_004b3205;
        }
        goto LAB_004b31df;
      }
    }
    pFVar11 = &wall->textures[0].texture;
  }
LAB_004b3205:
  uVar3 = pFVar11->texnum;
  CalcFracPos(this,wall,x,y);
  uVar9 = 0;
  if (((uVar3 < TexMan.Textures.Count) &&
      (uVar9 = 0, TexMan.Textures.Array[(int)uVar3].Texture != (FTexture *)0x0)) &&
     (uVar9 = 0, ((TexMan.Textures.Array[(int)uVar3].Texture)->field_0x31 & 1) == 0)) {
    uVar9 = uVar3;
  }
  return (FTextureID)uVar9;
}

Assistant:

FTextureID DBaseDecal::StickToWall (side_t *wall, double x, double y, F3DFloor *ffloor)
{
	Side = wall;
	WallPrev = wall->AttachedDecals;

	while (WallPrev != nullptr && WallPrev->WallNext != nullptr)
	{
		WallPrev = WallPrev->WallNext;
	}
	if (WallPrev != nullptr) WallPrev->WallNext = this;
	else wall->AttachedDecals = this;
	WallNext = nullptr;


	sector_t *front, *back;
	line_t *line;
	FTextureID tex;

	line = wall->linedef;
	if (line->sidedef[0] == wall)
	{
		front = line->frontsector;
		back = line->backsector;
	}
	else
	{
		front = line->backsector;
		back = line->frontsector;
	}
	if (back == NULL)
	{
		RenderFlags |= RF_RELMID;
		if (line->flags & ML_DONTPEGBOTTOM)
			Z -= front->GetPlaneTexZ(sector_t::floor);
		else
			Z -= front->GetPlaneTexZ(sector_t::ceiling);
		tex = wall->GetTexture(side_t::mid);
	}
	else if (back->floorplane.ZatPoint (x, y) >= Z)
	{
		RenderFlags |= RF_RELLOWER|RF_CLIPLOWER;
		if (line->flags & ML_DONTPEGBOTTOM)
			Z -= front->GetPlaneTexZ(sector_t::ceiling);
		else
			Z -= back->GetPlaneTexZ(sector_t::floor);
		tex = wall->GetTexture(side_t::bottom);
	}
	else if (back->ceilingplane.ZatPoint (x, y) <= Z)
	{
		RenderFlags |= RF_RELUPPER|RF_CLIPUPPER;
		if (line->flags & ML_DONTPEGTOP)
			Z -= front->GetPlaneTexZ(sector_t::ceiling);
		else
			Z -= back->GetPlaneTexZ(sector_t::ceiling);
		tex = wall->GetTexture(side_t::top);
	}
	else if (ffloor) // this is a 3d-floor segment - do this only if we know which one!
	{
		Sector=ffloor->model;
		RenderFlags |= RF_RELMID|RF_CLIPMID;
		if (line->flags & ML_DONTPEGBOTTOM)
			Z -= Sector->GetPlaneTexZ(sector_t::floor);
		else
			Z -= Sector->GetPlaneTexZ(sector_t::ceiling);

		if (ffloor->flags & FF_UPPERTEXTURE)
		{
			tex = wall->GetTexture(side_t::top);
		}
		else if (ffloor->flags & FF_LOWERTEXTURE)
		{
			tex = wall->GetTexture(side_t::bottom);
		}
		else
		{
			tex = ffloor->master->sidedef[0]->GetTexture(side_t::mid);
		}
	}
	else return FNullTextureID();
	CalcFracPos (wall, x, y);

	FTexture *texture = TexMan[tex];

	if (texture == NULL || texture->bNoDecals)
	{
		return FNullTextureID();
	}

	return tex;
}